

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void Arith(lua_State *L,StkId ra,TValue *rb,TValue *rc,TMS op)

{
  int iVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *i_o;
  TValue tempc;
  TValue tempb;
  TValue local_50;
  TValue local_40;
  
  pTVar2 = luaV_tonumber(rb,&local_40);
  if (pTVar2 != (TValue *)0x0) {
    pTVar3 = luaV_tonumber(rc,&local_50);
    if (pTVar3 != (TValue *)0x0) {
      (*(code *)(&DAT_0011bf24 + *(int *)(&DAT_0011bf24 + (ulong)(op - TM_ADD) * 4)))
                ((pTVar2->value).gc,(pTVar3->value).gc);
      return;
    }
  }
  iVar1 = call_binTM(L,rb,rc,ra,op);
  if (iVar1 == 0) {
    luaG_aritherror(L,rb,rc);
  }
  return;
}

Assistant:

static void Arith (lua_State *L, StkId ra, const TValue *rb,
                   const TValue *rc, TMS op) {
  TValue tempb, tempc;
  const TValue *b, *c;
  if ((b = luaV_tonumber(rb, &tempb)) != NULL &&
      (c = luaV_tonumber(rc, &tempc)) != NULL) {
    lua_Number nb = nvalue(b), nc = nvalue(c);
    switch (op) {
      case TM_ADD: setnvalue(ra, luai_numadd(nb, nc)); break;
      case TM_SUB: setnvalue(ra, luai_numsub(nb, nc)); break;
      case TM_MUL: setnvalue(ra, luai_nummul(nb, nc)); break;
      case TM_DIV: setnvalue(ra, luai_numdiv(nb, nc)); break;
      case TM_MOD: setnvalue(ra, luai_nummod(nb, nc)); break;
      case TM_POW: setnvalue(ra, luai_numpow(nb, nc)); break;
      case TM_UNM: setnvalue(ra, luai_numunm(nb)); break;
      default: lua_assert(0); break;
    }
  }
  else if (!call_binTM(L, rb, rc, ra, op))
    luaG_aritherror(L, rb, rc);
}